

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# homomorphism_model.cc
# Opt level: O3

void __thiscall
gss::innards::HomomorphismModel::_build_extra_shape
          (HomomorphismModel *this,
          vector<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_> *graph_rows,
          uint size,uint *idx,InputGraph *shape,bool injective,int count,bool pattern)

{
  size_t *psVar1;
  undefined8 *puVar2;
  long lVar3;
  _Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false> _Var4;
  _List_node_base *p_Var5;
  code *pcVar6;
  code *pcVar7;
  bool bVar8;
  SVOBitset *pSVar9;
  undefined8 uVar10;
  pointer pSVar11;
  _List_node_base *p_Var12;
  int iVar13;
  int iVar14;
  ulong uVar15;
  uint uVar16;
  uint uVar17;
  pointer pSVar18;
  string_view l;
  string_view l_00;
  int seen_count;
  value_type nv;
  HomomorphismResult child_result;
  int local_22c;
  InputGraph local_228;
  int local_21c;
  uint *local_218;
  vector<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_> *local_210;
  long local_208;
  ulong local_200;
  undefined **local_1f8;
  InputGraph *local_1f0;
  undefined1 local_1e8 [16];
  undefined1 auStack_1d8 [40];
  code *pcStack_1b0;
  code *pcStack_1a8;
  undefined4 local_1a0;
  undefined8 local_198;
  undefined8 local_190;
  undefined2 local_188;
  undefined1 uStack_186;
  undefined1 uStack_185;
  undefined1 local_184;
  undefined1 local_183;
  undefined4 local_180;
  _List_base<std::tuple<std::unique_ptr<InputGraph,_std::default_delete<InputGraph>_>,_bool,_int>,_std::allocator<std::tuple<std::unique_ptr<InputGraph,_std::default_delete<InputGraph>_>,_bool,_int>_>_>
  local_178;
  undefined1 uStack_160;
  undefined1 uStack_15f;
  undefined1 uStack_15e;
  _List_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_158;
  undefined1 local_140 [24];
  unique_ptr<gss::innards::Lackey,_std::default_delete<gss::innards::Lackey>_> uStack_128;
  bool local_120;
  PropagateUsingLackey local_11c;
  _Optional_payload_base<gss::ProofOptions> local_118;
  HomomorphismResult local_c8;
  
  uVar16 = 0;
  local_218 = idx;
  local_210 = graph_rows;
  local_1f0 = shape;
  InputGraph::InputGraph(&local_228,size,true,false);
  if (size != 0) {
    do {
      SVOBitset::SVOBitset
                ((SVOBitset *)local_1e8,
                 (local_210->
                 super__Vector_base<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>
                 )._M_impl.super__Vector_impl_data._M_start + this->max_graphs * uVar16);
      if (uVar16 != 0) {
        uVar15 = 0;
        do {
          pSVar9 = (SVOBitset *)local_1e8;
          if (0x10 < (uint)(undefined4)local_178._M_impl._M_node._M_size) {
            pSVar9 = (SVOBitset *)local_1e8._0_8_;
          }
          iVar14 = (int)uVar15;
          iVar13 = iVar14 + 0x3f;
          if (-1 < iVar14) {
            iVar13 = iVar14;
          }
          if (((pSVar9->_data).short_data[iVar13 >> 6] >> (uVar15 & 0x3f) & 1) != 0) {
            InputGraph::add_edge(&local_228,uVar16,iVar14);
          }
          uVar15 = (ulong)(iVar14 + 1U);
        } while (uVar16 != iVar14 + 1U);
      }
      if ((0x10 < (uint)(undefined4)local_178._M_impl._M_node._M_size) &&
         ((SVOBitset *)local_1e8._0_8_ != (SVOBitset *)0x0)) {
        operator_delete__((void *)local_1e8._0_8_);
      }
      uVar16 = uVar16 + 1;
    } while (uVar16 != size);
    uVar16 = 0;
    local_21c = (injective ^ 1) * 2;
    local_1f8 = &PTR__RestartsSchedule_001a0670;
    do {
      bVar8 = Timeout::should_abort
                        (*(Timeout **)
                          ((this->_imp)._M_t.
                           super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                           .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>.
                          _M_head_impl)->params);
      if (bVar8) break;
      if (uVar16 != 0) {
        uVar17 = uVar16 + 0x3f;
        if (-1 < (int)uVar16) {
          uVar17 = uVar16;
        }
        uVar15 = 0;
        local_208 = (long)((int)uVar17 >> 6);
        local_200 = 1L << ((ulong)uVar16 & 0x3f);
        do {
          iVar14 = (int)uVar15;
          bVar8 = Timeout::should_abort
                            (*(Timeout **)
                              ((this->_imp)._M_t.
                               super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                               .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>
                              ._M_head_impl)->params);
          if (bVar8) break;
          auStack_1d8._12_4_ = 0;
          auStack_1d8[0x10] = 0;
          local_178._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_178;
          local_158._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_158;
          auStack_1d8._24_8_ = (int *)0x0;
          auStack_1d8._32_8_ = (int *)0x0;
          pcStack_1b0 = (code *)0x0;
          pcStack_1a8 = (code *)0x0;
          register0x00001200 = ZEXT416(0) << 0x40;
          auStack_1d8[0] = 0;
          auStack_1d8._1_7_ = 0;
          auStack_1d8[8] = 0;
          local_1e8[8] = 0;
          local_1e8._9_7_ = 0;
          local_1a0 = 1;
          local_198 = (long *)0x0;
          local_190 = 0x1ffffffff;
          _local_188 = 0x10000;
          local_184 = 0;
          local_183 = 0;
          local_180 = 4;
          local_140._0_8_ = local_140;
          uStack_160 = false;
          uStack_15f = false;
          uStack_15e = false;
          local_178._M_impl._M_node._M_size._0_4_ = 0;
          local_178._M_impl._M_node._M_size._4_4_ = 0;
          local_158._M_impl._M_node._M_size = 0;
          local_11c = Never;
          local_118._M_engaged = false;
          local_120 = false;
          puVar2 = (undefined8 *)
                   ((this->_imp)._M_t.
                    super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                    .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>.
                   _M_head_impl)->params;
          local_1e8._0_8_ = *puVar2;
          local_178._M_impl._M_node.super__List_node_base._M_prev =
               local_178._M_impl._M_node.super__List_node_base._M_next;
          local_158._M_impl._M_node.super__List_node_base._M_prev =
               local_158._M_impl._M_node.super__List_node_base._M_next;
          local_140._8_8_ = local_140._0_8_;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_1e8 + 8),
                     (__shared_count<(__gnu_cxx::_Lock_policy)2> *)(puVar2 + 1));
          uVar10 = *(undefined8 *)
                    ((long)((this->_imp)._M_t.
                            super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                            .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>.
                           _M_head_impl)->params + 0x10);
          auStack_1d8[0] = (undefined1)uVar10;
          auStack_1d8._1_7_ = (undefined7)((ulong)uVar10 >> 8);
          auStack_1d8._8_4_ = (uint)(uint3)auStack_1d8._9_3_ << 8;
          uVar10 = operator_new(8);
          *(undefined ***)uVar10 = local_1f8;
          if ((long *)local_198 != (long *)0x0) {
            lVar3 = *(long *)local_198;
            local_198 = uVar10;
            (**(code **)(lVar3 + 8))();
            uVar10 = local_198;
          }
          local_198 = uVar10;
          pcVar7 = pcStack_1a8;
          pcVar6 = pcStack_1b0;
          uStack_186 = 0;
          local_22c = 0;
          auStack_1d8._12_4_ = local_21c;
          local_183 = 1;
          if (1 < count) {
            auStack_1d8[0x10] = 1;
            local_c8.mapping._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = auStack_1d8._32_8_
            ;
            local_c8.mapping._M_t._M_impl._0_8_ = auStack_1d8._24_8_;
            auStack_1d8._32_8_ = &count;
            pcStack_1b0 = std::
                          _Function_handler<bool_(const_std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ciaranm[P]glasgow-subgraph-solver/gss/innards/homomorphism_model.cc:1172:51)>
                          ::_M_manager;
            pcStack_1a8 = std::
                          _Function_handler<bool_(const_std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ciaranm[P]glasgow-subgraph-solver/gss/innards/homomorphism_model.cc:1172:51)>
                          ::_M_invoke;
            local_c8.mapping._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                 (_Base_ptr)pcVar6;
            local_c8.mapping._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                 (_Base_ptr)pcVar7;
            auStack_1d8._24_8_ = &local_22c;
            if (pcVar6 != (code *)0x0) {
              (*pcVar6)(&local_c8,&local_c8,3);
            }
          }
          l._M_str = "from";
          l._M_len = 4;
          InputGraph::set_vertex_label(&local_228,uVar16,l);
          l_00._M_str = "to";
          l_00._M_len = 2;
          InputGraph::set_vertex_label(&local_228,iVar14,l_00);
          solve_homomorphism_problem(&local_c8,local_1f0,&local_228,(HomomorphismParams *)local_1e8)
          ;
          if (count < 2) {
            if (local_c8.mapping._M_t._M_impl.super__Rb_tree_header._M_node_count != 0)
            goto LAB_001363df;
          }
          else if (count <= local_22c) {
LAB_001363df:
            pSVar11 = (local_210->
                      super__Vector_base<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            uVar17 = this->max_graphs * uVar16 + *local_218;
            if (pSVar11[uVar17].n_words < 0x11) {
              pSVar18 = pSVar11 + uVar17;
            }
            else {
              pSVar18 = (pointer)pSVar11[uVar17]._data.short_data[0];
            }
            iVar13 = iVar14 + 0x3f;
            if (-1 < iVar14) {
              iVar13 = iVar14;
            }
            uVar17 = this->max_graphs * iVar14 + *local_218;
            (pSVar18->_data).short_data[iVar13 >> 6] =
                 (pSVar18->_data).short_data[iVar13 >> 6] | 1L << (uVar15 & 0x3f);
            if (pSVar11[uVar17].n_words < 0x11) {
              pSVar11 = pSVar11 + uVar17;
            }
            else {
              pSVar11 = (pointer)pSVar11[uVar17]._data.short_data[0];
            }
            (pSVar11->_data).short_data[local_208] =
                 (pSVar11->_data).short_data[local_208] | local_200;
          }
          InputGraph::set_vertex_label(&local_228,uVar16,(string_view)(ZEXT816(0x17f2bd) << 0x40));
          InputGraph::set_vertex_label(&local_228,iVar14,(string_view)(ZEXT816(0x17f2bd) << 0x40));
          if ((local_c8.solution_count.m_backend.
               super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
               .m_internal == false) &&
             (local_c8.solution_count.m_backend.
              super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
              .m_alias == false)) {
            operator_delete(local_c8.solution_count.m_backend.
                            super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                            .m_data.ld.data,
                            (ulong)local_c8.solution_count.m_backend.
                                   super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                                   .m_data.ld.capacity << 3);
          }
          std::__cxx11::
          _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::_M_clear((_List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)((long)&local_c8 + 0x40));
          std::
          _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
          ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                       *)&local_c8);
          if (local_118._M_engaged == true) {
            std::_Optional_payload_base<gss::ProofOptions>::_M_destroy(&local_118);
          }
          std::unique_ptr<gss::innards::Lackey,_std::default_delete<gss::innards::Lackey>_>::
          ~unique_ptr(&uStack_128);
          std::__cxx11::
          _List_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::_M_clear((_List_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)local_140);
          std::__cxx11::
          _List_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::_M_clear(&local_158);
          std::__cxx11::
          _List_base<std::tuple<std::unique_ptr<InputGraph,_std::default_delete<InputGraph>_>,_bool,_int>,_std::allocator<std::tuple<std::unique_ptr<InputGraph,_std::default_delete<InputGraph>_>,_bool,_int>_>_>
          ::_M_clear(&local_178);
          if ((long *)local_198 != (long *)0x0) {
            (**(code **)(*(long *)local_198 + 8))();
          }
          local_198 = 0;
          if (pcStack_1b0 != (code *)0x0) {
            (*pcStack_1b0)(auStack_1d8 + 0x18,auStack_1d8 + 0x18,3);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT71(local_1e8._9_7_,local_1e8[8])
              != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       CONCAT71(local_1e8._9_7_,local_1e8[8]));
          }
          uVar15 = (ulong)(iVar14 + 1U);
        } while (uVar16 != iVar14 + 1U);
      }
      uVar16 = uVar16 + 1;
    } while (uVar16 != size);
  }
  if (pattern != false) {
    _Var4._M_head_impl =
         (this->_imp)._M_t.
         super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
         ._M_t.
         super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
         .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>._M_head_impl;
    local_1e8._0_8_ = (SVOBitset *)auStack_1d8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1e8,"extra_shape","");
    p_Var12 = (_List_node_base *)operator_new(0x30);
    p_Var12[1]._M_next = p_Var12 + 2;
    if ((SVOBitset *)local_1e8._0_8_ == (SVOBitset *)auStack_1d8) {
      p_Var12[2]._M_next = (_List_node_base *)CONCAT71(auStack_1d8._1_7_,auStack_1d8[0]);
      p_Var12[2]._M_prev = (_List_node_base *)CONCAT44(auStack_1d8._12_4_,auStack_1d8._8_4_);
    }
    else {
      p_Var12[1]._M_next = (_List_node_base *)local_1e8._0_8_;
      p_Var12[2]._M_next = (_List_node_base *)CONCAT71(auStack_1d8._1_7_,auStack_1d8[0]);
    }
    p_Var5 = (_List_node_base *)CONCAT71(local_1e8._9_7_,local_1e8[8]);
    local_1e8[8] = 0;
    local_1e8._9_7_ = 0;
    auStack_1d8[0] = 0;
    p_Var12[1]._M_prev = p_Var5;
    local_1e8._0_8_ = (SVOBitset *)auStack_1d8;
    std::__detail::_List_node_base::_M_hook(p_Var12);
    psVar1 = (size_t *)((long)&(_Var4._M_head_impl)->supplemental_graph_names + 0x10);
    *psVar1 = *psVar1 + 1;
    if ((SVOBitset *)local_1e8._0_8_ != (SVOBitset *)auStack_1d8) {
      operator_delete((void *)local_1e8._0_8_,CONCAT71(auStack_1d8._1_7_,auStack_1d8[0]) + 1);
    }
  }
  *local_218 = *local_218 + 1;
  InputGraph::~InputGraph(&local_228);
  return;
}

Assistant:

auto HomomorphismModel::_build_extra_shape(vector<SVOBitset> & graph_rows, unsigned size, unsigned & idx, InputGraph & shape,
    bool injective, int count, bool pattern) -> void
{
    InputGraph master_graph(size, true, false);

    for (unsigned v = 0; v < size; ++v) {
        auto nv = graph_rows[v * max_graphs + 0];
        for (unsigned w = 0; w < v; ++w) {
            if (nv.test(w))
                master_graph.add_edge(v, w);
        }
    }

    for (unsigned v = 0; v < size && ! _imp->params.timeout->should_abort(); ++v) {
        for (unsigned w = 0; w < v && ! _imp->params.timeout->should_abort(); ++w) {
            HomomorphismParams child_params;
            child_params.timeout = _imp->params.timeout;
            child_params.start_time = _imp->params.start_time;
            child_params.induced = false;
            child_params.restarts_schedule = make_unique<NoRestartsSchedule>();
            child_params.clique_detection = false;
            child_params.injectivity = injective ? Injectivity::Injective : Injectivity::NonInjective;
            child_params.no_supplementals = true;

            int seen_count = 0;
            if (count > 1) {
                child_params.count_solutions = true;
                child_params.enumerate_callback = [&](const VertexToVertexMapping &) {
                    return ++seen_count < count;
                };
            }

            master_graph.set_vertex_label(v, "from");
            master_graph.set_vertex_label(w, "to");
            auto child_result = solve_homomorphism_problem(shape, master_graph, child_params);
            if ((count > 1) ? seen_count >= count : ! child_result.mapping.empty()) {
                graph_rows[v * max_graphs + idx].set(w);
                graph_rows[w * max_graphs + idx].set(v);
            }
            master_graph.set_vertex_label(v, "");
            master_graph.set_vertex_label(w, "");
        }
    }

    if (pattern)
        _imp->supplemental_graph_names.push_back("extra_shape");
    ++idx;
}